

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_copy.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::Bind
          (BoundStatement *__return_storage_ptr__,Binder *this,CopyStatement *stmt,
          CopyToType copy_to_type)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  pointer pbVar2;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var3;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var4;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> _Var5;
  Binder *this_00;
  pointer pCVar6;
  pointer pBVar7;
  pointer pSVar8;
  StatementProperties *pSVar9;
  undefined7 in_register_00000009;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer args;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *puVar10;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_78;
  ParsedExpression *local_70;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_68;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> local_60;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *local_58;
  undefined4 local_4c;
  CopyStatement *local_48;
  BoundStatement *local_40;
  Binder *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,copy_to_type);
  puVar10 = &stmt->info;
  local_48 = stmt;
  local_38 = this;
  pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (puVar10);
  if ((pCVar6->is_from == false) &&
     (pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                         (puVar10),
     (pCVar6->select_statement).
     super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
     super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
     super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
     super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0)) {
    make_uniq<duckdb::BaseTableRef>();
    local_58 = puVar10;
    unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(puVar10);
    pBVar7 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
             operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                         *)&local_60);
    ::std::__cxx11::string::_M_assign((string *)&pBVar7->catalog_name);
    unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(local_58);
    pBVar7 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
             operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                         *)&local_60);
    ::std::__cxx11::string::_M_assign((string *)&pBVar7->schema_name);
    unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(local_58);
    pBVar7 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
             operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                         *)&local_60);
    ::std::__cxx11::string::_M_assign((string *)&pBVar7->table_name);
    local_40 = __return_storage_ptr__;
    make_uniq<duckdb::SelectNode>();
    _Var5._M_head_impl = local_60._M_head_impl;
    local_60._M_head_impl = (BaseTableRef *)0x0;
    pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
             operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_68);
    _Var1._M_head_impl =
         (pSVar8->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar8->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
         &(_Var5._M_head_impl)->super_TableRef;
    if (_Var1._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
    }
    puVar10 = local_58;
    pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (local_58);
    if ((pCVar6->select_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pCVar6->select_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
               operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                           *)&local_68);
      make_uniq<duckdb::StarExpression>();
      local_78._M_head_impl = local_70;
      local_70 = (ParsedExpression *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar8->select_list,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_78);
      if (local_78._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_78._M_head_impl = (ParsedExpression *)0x0;
      if (local_70 != (ParsedExpression *)0x0) {
        (*(local_70->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    else {
      pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                         (puVar10);
      pbVar2 = (pCVar6->select_list).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (args = (pCVar6->select_list).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; args != pbVar2; args = args + 1) {
        pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                 operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                             *)&local_68);
        make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&>((duckdb *)&local_70,args);
        local_78._M_head_impl = local_70;
        local_70 = (ParsedExpression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar8->select_list,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_78);
        if (local_78._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_78._M_head_impl = (ParsedExpression *)0x0;
        if (local_70 != (ParsedExpression *)0x0) {
          (*(local_70->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
    }
    _Var4._M_head_impl = local_68._M_head_impl;
    local_68._M_head_impl = (QueryNode *)0x0;
    pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (local_58);
    _Var3._M_head_impl =
         (pCVar6->select_statement).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pCVar6->select_statement).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var3._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
    }
    __return_storage_ptr__ = local_40;
    if (local_68._M_head_impl != (QueryNode *)0x0) {
      (*(local_68._M_head_impl)->_vptr_QueryNode[1])();
    }
    puVar10 = local_58;
    if (local_60._M_head_impl != (BaseTableRef *)0x0) {
      (*((local_60._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
      puVar10 = local_58;
    }
  }
  this_00 = local_38;
  pSVar9 = GetStatementProperties(local_38);
  pSVar9->allow_stream_result = false;
  pSVar9->return_type = CHANGED_ROWS;
  pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (puVar10);
  if (pCVar6->is_from == true) {
    BindCopyFrom(__return_storage_ptr__,this_00,local_48);
  }
  else {
    BindCopyTo(__return_storage_ptr__,this_00,local_48,(CopyToType)local_4c);
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(CopyStatement &stmt, CopyToType copy_to_type) {
	if (!stmt.info->is_from && !stmt.info->select_statement) {
		// copy table into file without a query
		// generate SELECT * FROM table;
		auto ref = make_uniq<BaseTableRef>();
		ref->catalog_name = stmt.info->catalog;
		ref->schema_name = stmt.info->schema;
		ref->table_name = stmt.info->table;

		auto statement = make_uniq<SelectNode>();
		statement->from_table = std::move(ref);
		if (!stmt.info->select_list.empty()) {
			for (auto &name : stmt.info->select_list) {
				statement->select_list.push_back(make_uniq<ColumnRefExpression>(name));
			}
		} else {
			statement->select_list.push_back(make_uniq<StarExpression>());
		}
		stmt.info->select_statement = std::move(statement);
	}

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::CHANGED_ROWS;
	if (stmt.info->is_from) {
		return BindCopyFrom(stmt);
	} else {
		return BindCopyTo(stmt, copy_to_type);
	}
}